

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.c
# Opt level: O1

int zero_segment_mix(mixed_segment *segment)

{
  mixed_buffer *buffer_00;
  uint32_t frames;
  float *buffer;
  uint32_t local_24;
  float *local_20;
  
  buffer_00 = (mixed_buffer *)segment->data;
  local_24 = 0xffffffff;
  mixed_buffer_request_write(&local_20,&local_24,buffer_00);
  memset(local_20,0,(ulong)local_24 << 2);
  mixed_buffer_finish_write(local_24,buffer_00);
  return 1;
}

Assistant:

int zero_segment_mix(struct mixed_segment *segment){
  struct mixed_buffer *data = (struct mixed_buffer *)segment->data;
  float *restrict buffer;
  uint32_t frames = UINT32_MAX;
  mixed_buffer_request_write(&buffer, &frames, data);
  memset(buffer, 0, frames*sizeof(float));
  mixed_buffer_finish_write(frames, data);
  return 1;
}